

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttributeInfo *attributeInfo)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1f0;
  string local_1d0;
  string formatName;
  ostringstream caseName;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
  pcVar1 = ::vk::getFormatName(*(VkFormat *)(this + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&formatName,pcVar1,(allocator<char> *)&local_1f0);
  poVar2 = std::operator<<((ostream *)&caseName,
                           *(char **)(VertexInputTest::s_glslTypeDescriptions +
                                     (ulong)*(uint *)this * 0x18));
  poVar2 = std::operator<<(poVar2,"_as_");
  std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&formatName);
  de::toLower(&local_1f0,&local_1d0);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  std::operator<<(poVar2,"_rate_");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  pcVar1 = "instance";
  if (*(int *)(this + 8) == 0) {
    pcVar1 = "vertex";
  }
  std::operator<<((ostream *)&caseName,pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&formatName);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
  return __return_storage_ptr__;
}

Assistant:

std::string getAttributeInfoCaseName (const VertexInputTest::AttributeInfo& attributeInfo)
{
	std::ostringstream	caseName;
	const std::string	formatName	= getFormatName(attributeInfo.vkType);

	caseName << VertexInputTest::s_glslTypeDescriptions[attributeInfo.glslType].name << "_as_" << de::toLower(formatName.substr(10)) << "_rate_";

	if (attributeInfo.inputRate == VK_VERTEX_INPUT_RATE_VERTEX)
		caseName <<  "vertex";
	else
		caseName <<  "instance";

	return caseName.str();
}